

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
* __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodePriceUpdate_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           *__return_storage_ptr__,PriceUpdateDecoder *this,ByteBuffer *buffer,
          IDataDictionary *data_dictionary)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  ByteBuffer *buffer_00;
  bool bVar4;
  FieldDef field_def;
  PriceField local_70;
  undefined1 local_60 [48];
  
  buffer_00 = (ByteBuffer *)this;
  uVar2 = tools::Varint::ReadU32((InputStream *)this);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    uVar3 = tools::Varint::ReadU32((InputStream *)this);
    if (uVar3 == 0x7fffffff) {
      uVar3 = tools::Varint::ReadU32((InputStream *)this);
      GetFieldDef((FieldDef *)local_60,buffer_00,(IDataDictionary *)buffer,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                   *)data_dictionary,uVar3);
      buffer_00 = (ByteBuffer *)(local_60 + 8);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
      ::_M_emplace_unique<std::__cxx11::string&,bidfx_public_api::price::PriceField&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
                  *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_00,
                 (PriceField *)PriceField::null);
    }
    else {
      GetFieldDef((FieldDef *)local_60,buffer_00,(IDataDictionary *)buffer,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
                   *)data_dictionary,uVar3);
      DecodeField((PriceUpdateDecoder *)&local_70,(ByteBuffer *)this,(FieldDef *)local_60);
      buffer_00 = (ByteBuffer *)(local_60 + 8);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
      ::_M_emplace_unique<std::__cxx11::string&,bidfx_public_api::price::PriceField>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
                  *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_00,
                 &local_70);
      PriceField::~PriceField(&local_70);
    }
    std::__cxx11::string::~string((string *)(local_60 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, PriceField> PriceUpdateDecoder::DecodePriceUpdate(ByteBuffer& buffer, IDataDictionary& data_dictionary)
{
    uint32_t size = Varint::ReadU32(buffer);
    std::map<std::string, PriceField> price_map;
    for (uint32_t i = 0; i < size; i++)
    {
        uint32_t fid = Varint::ReadU32(buffer);
        if (fid == FieldDef::REFERENCING_FID)
        {
            uint32_t referenced_fid = Varint::ReadU32(buffer);
            FieldDef field_def = GetFieldDef(buffer, data_dictionary, price_map, referenced_fid);
            price_map.emplace(field_def.name_, PriceField::null);
        }
        else
        {
            FieldDef field_def = GetFieldDef(buffer, data_dictionary, price_map, fid);
            price_map.emplace(field_def.name_, DecodeField(buffer, field_def));
        }
    }
    return price_map;
}